

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::TimeScaleDirectiveSyntax>
          (DeepCloneVisitor *this,TimeScaleDirectiveSyntax *node,BumpAllocator *alloc)

{
  TimeScaleDirectiveSyntax *pTVar1;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone(&(node->super_DirectiveSyntax).directive,alloc);
  local_48 = parsing::Token::deepClone(&node->timeUnit,alloc);
  local_58 = parsing::Token::deepClone(&node->slash,alloc);
  local_68 = parsing::Token::deepClone(&node->timePrecision,alloc);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TimeScaleDirectiveSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_38,&local_48,&local_58,&local_68);
  return (SyntaxNode *)pTVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }